

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kdasm.c
# Opt level: O0

void d68020_cpbcc_32(void)

{
  char *pcVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  char *pcVar6;
  uint new_pc;
  uint extension;
  
  uVar2 = g_cpu_pc;
  if ((g_cpu_type & 0x1c) == 0) {
    if ((g_cpu_ir & 0xf000) == 0xf000) {
      d68000_1111();
    }
    else {
      d68000_illegal();
    }
  }
  else {
    uVar3 = dasm_read_imm_16(2);
    uVar4 = dasm_read_imm_32(4);
    uVar5 = g_cpu_ir >> 9;
    pcVar1 = g_cpcc[g_cpu_ir & 0x3f];
    pcVar6 = get_imm_str_s(1);
    sprintf(g_dasm_str,"%db%-4s  %s; $%x (extension = $%x) (2-3)",(ulong)(uVar5 & 7),pcVar1,pcVar6,
            (ulong)(uVar4 + uVar2),uVar3);
  }
  return;
}

Assistant:

static void d68020_cpbcc_32(void)
{
	uint extension;
	uint new_pc = g_cpu_pc;
	LIMIT_CPU_TYPES(M68020_PLUS);
	extension = read_imm_16();
	new_pc += read_imm_32();
	sprintf(g_dasm_str, "%db%-4s  %s; $%x (extension = $%x) (2-3)", (g_cpu_ir>>9)&7, g_cpcc[g_cpu_ir&0x3f], get_imm_str_s16(), new_pc, extension);
}